

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

void __thiscall
GmmLib::Table::UpdatePoolFence(Table *this,GMM_UMD_SYNCCONTEXT *UmdContext,bool ClearNode)

{
  HANDLE pvVar1;
  SyncInfo *pSVar2;
  uint64_t uVar3;
  bool ClearNode_local;
  GMM_UMD_SYNCCONTEXT *UmdContext_local;
  Table *this_local;
  
  if (ClearNode) {
    (this->BBInfo).BBQueueHandle = (HANDLE)0x0;
    (this->BBInfo).BBFence = 0;
  }
  else {
    pvVar1 = UmdContext->BBFenceObj;
    (this->BBInfo).BBQueueHandle = pvVar1;
    pSVar2 = GmmPageTablePool::GetPoolBBInfo(this->PoolElem);
    pSVar2->BBQueueHandle = pvVar1;
    uVar3 = UmdContext->BBLastFence + 1;
    (this->BBInfo).BBFence = uVar3;
    pSVar2 = GmmPageTablePool::GetPoolBBInfo(this->PoolElem);
    pSVar2->BBFence = uVar3;
  }
  return;
}

Assistant:

void GmmLib::Table::UpdatePoolFence(GMM_UMD_SYNCCONTEXT *UmdContext, bool ClearNode)
{
    if(!ClearNode)
    {
        //update both node and pool with current fence/handle
        PoolElem->GetPoolBBInfo().BBQueueHandle =
        BBInfo.BBQueueHandle = UmdContext->BBFenceObj;
        PoolElem->GetPoolBBInfo().BBFence =
        BBInfo.BBFence = UmdContext->BBLastFence + 1; //Save incremented fence value, since DX does it during submission
    }
    else
    {
        //Clear node fence/handle
        BBInfo.BBQueueHandle = 0;
        BBInfo.BBFence       = 0;
    }
}